

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

reference __thiscall
QVLABase<char_const*>::emplace_back_impl<char_const*const&>
          (QVLABase<const_char_*> *this,qsizetype prealloc,void *array,char **args)

{
  QVLABase<const_char_*> *this_00;
  QVLABase<const_char_*> *pQVar1;
  iterator ptr;
  char **ppcVar2;
  char **in_RCX;
  void *in_RDX;
  qsizetype in_RSI;
  QVLABaseBase *in_RDI;
  reference r;
  QVLABaseBase *this_01;
  
  this_01 = in_RDI;
  this_00 = (QVLABase<const_char_*> *)QVLABaseBase::size(in_RDI);
  pQVar1 = (QVLABase<const_char_*> *)QVLABaseBase::capacity(in_RDI);
  if (this_00 == pQVar1) {
    QVLABase<const_char_*>::growBy
              ((QVLABase<const_char_*> *)this_01,in_RSI,in_RDX,(qsizetype)in_RCX);
  }
  ptr = QVLABase<const_char_*>::end(this_00);
  ppcVar2 = q20::construct_at<char_const*,char_const*const&,void>(ptr,in_RCX);
  in_RDI->s = in_RDI->s + 1;
  return ppcVar2;
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }